

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# physfs_lzmasdk.h
# Opt level: O0

SRes Bcj2Dec_Decode(CBcj2Dec *p)

{
  byte bVar1;
  byte bVar2;
  byte bVar3;
  byte bVar4;
  ushort uVar5;
  UInt32 UVar6;
  Byte *pBVar7;
  Byte BVar8;
  uint uVar11;
  int iVar12;
  byte *pbVar13;
  long lVar14;
  UInt16 *pUVar15;
  Byte *pBVar16;
  uint local_b4;
  UInt32 _vvv__1;
  Byte *_ppp__1;
  UInt32 _vvv_;
  Byte *_ppp_;
  SizeT i;
  SizeT rem;
  Byte *dest_2;
  Byte *cur;
  uint cj;
  UInt32 val;
  Byte prev;
  Byte b_1;
  UInt16 *prob;
  UInt32 ttt;
  UInt32 bound;
  Byte b;
  SizeT num;
  Byte *dest_1;
  Byte *srcLim;
  Byte *src;
  Byte *dest;
  CBcj2Dec *p_local;
  Byte BVar9;
  Byte BVar10;
  
  if (p->range < 6) {
    p->state = 9;
    while (p->range != 5) {
      if ((p->range == 1) && (p->code != 0)) {
        return 1;
      }
      if (p->bufs[3] == p->lims[3]) {
        p->state = 3;
        return 0;
      }
      UVar6 = p->code;
      pbVar13 = p->bufs[3];
      p->bufs[3] = pbVar13 + 1;
      p->code = UVar6 << 8 | (uint)*pbVar13;
      p->range = p->range + 1;
    }
    if (p->code == 0xffffffff) {
      return 1;
    }
    p->range = 0xffffffff;
  }
  else if (3 < p->state) {
    while (p->state < 8) {
      pBVar7 = p->dest;
      if (pBVar7 == p->destLim) {
        return 0;
      }
      uVar11 = p->state;
      p->state = uVar11 + 1;
      *pBVar7 = p->temp[uVar11 - 4];
      p->dest = pBVar7 + 1;
    }
  }
  do {
    while ((p->state != 1 && (p->state != 2))) {
      if (p->range < 0x1000000) {
        if (p->bufs[3] == p->lims[3]) {
          p->state = 3;
          return 0;
        }
        p->range = p->range << 8;
        UVar6 = p->code;
        pbVar13 = p->bufs[3];
        p->bufs[3] = pbVar13 + 1;
        p->code = UVar6 << 8 | (uint)*pbVar13;
      }
      srcLim = p->bufs[0];
      _bound = (long)p->lims[0] - (long)srcLim;
      if (_bound == 0) {
        p->state = 0;
        return 0;
      }
      num = (SizeT)p->dest;
      if (((long)p->destLim - num < _bound) && (_bound = (long)p->destLim - num, _bound == 0)) {
        p->state = 8;
        return 0;
      }
      pbVar13 = srcLim + _bound;
      if ((p->temp[3] == '\x0f') && ((*srcLim & 0xf0) == 0x80)) {
        *(Byte *)num = *srcLim;
      }
      else {
        do {
          while( true ) {
            bVar1 = *srcLim;
            *(byte *)num = bVar1;
            if (bVar1 == 0xf) break;
            if ((bVar1 & 0xfe) == 0xe8) goto LAB_00117be7;
            num = num + 1;
            srcLim = srcLim + 1;
            if (srcLim == pbVar13) goto LAB_00117be7;
          }
          num = num + 1;
          srcLim = srcLim + 1;
          if (srcLim == pbVar13) goto LAB_00117be7;
        } while ((*srcLim & 0xf0) != 0x80);
        *(Byte *)num = *srcLim;
      }
LAB_00117be7:
      lVar14 = (long)srcLim - (long)p->bufs[0];
      if (srcLim == pbVar13) {
        p->temp[3] = srcLim[-1];
        p->bufs[0] = srcLim;
        p->ip = (int)lVar14 + p->ip;
        p->dest = p->dest + lVar14;
        uVar11 = 8;
        if (p->bufs[0] == p->lims[0]) {
          uVar11 = 0;
        }
        p->state = uVar11;
        return 0;
      }
      BVar8 = *srcLim;
      if (lVar14 == 0) {
        bVar1 = p->temp[3];
      }
      else {
        bVar1 = srcLim[-1];
      }
      p->temp[3] = BVar8;
      p->bufs[0] = srcLim + 1;
      p->ip = (int)(lVar14 + 1) + p->ip;
      p->dest = p->dest + lVar14 + 1;
      if (BVar8 == 0xe8) {
        local_b4 = bVar1 + 2;
      }
      else {
        local_b4 = (uint)(BVar8 == 0xe9);
      }
      pUVar15 = p->probs + local_b4;
      uVar5 = *pUVar15;
      uVar11 = (p->range >> 0xb) * (uint)uVar5;
      if (uVar11 <= p->code) {
        p->range = p->range - uVar11;
        p->code = p->code - uVar11;
        *pUVar15 = uVar5 - (uVar5 >> 5);
        goto LAB_00117dc6;
      }
      p->range = uVar11;
      *pUVar15 = uVar5 + (short)(0x800 - uVar5 >> 5);
    }
    p->state = 9;
LAB_00117dc6:
    uVar11 = 2;
    if (p->temp[3] == 0xe8) {
      uVar11 = 1;
    }
    pbVar13 = p->bufs[uVar11];
    if (pbVar13 == p->lims[uVar11]) {
      p->state = uVar11;
      goto LAB_00117fea;
    }
    bVar1 = *pbVar13;
    bVar2 = pbVar13[1];
    bVar3 = pbVar13[2];
    bVar4 = pbVar13[3];
    p->bufs[uVar11] = pbVar13 + 4;
    p->ip = p->ip + 4;
    iVar12 = ((uint)bVar1 << 0x18 | (uint)bVar2 << 0x10 | (uint)bVar3 << 8 | (uint)bVar4) - p->ip;
    pBVar7 = p->dest;
    pBVar16 = p->destLim + -(long)pBVar7;
    BVar8 = (Byte)((uint)iVar12 >> 8);
    BVar9 = (Byte)((uint)iVar12 >> 0x10);
    BVar10 = (Byte)((uint)iVar12 >> 0x18);
    if (pBVar16 < (Byte *)0x4) {
      p->temp[0] = (Byte)iVar12;
      p->temp[1] = BVar8;
      p->temp[2] = BVar9;
      p->temp[3] = BVar10;
      for (_ppp_ = (Byte *)0x0; _ppp_ < pBVar16; _ppp_ = _ppp_ + 1) {
        pBVar7[(long)_ppp_] = p->temp[(long)_ppp_];
      }
      p->dest = pBVar7 + (long)pBVar16;
      p->state = (int)pBVar16 + 4;
LAB_00117fea:
      if ((p->range < 0x1000000) && (p->bufs[3] != p->lims[3])) {
        p->range = p->range << 8;
        UVar6 = p->code;
        pbVar13 = p->bufs[3];
        p->bufs[3] = pbVar13 + 1;
        p->code = UVar6 << 8 | (uint)*pbVar13;
      }
      return 0;
    }
    *pBVar7 = (Byte)iVar12;
    pBVar7[1] = BVar8;
    pBVar7[2] = BVar9;
    pBVar7[3] = BVar10;
    p->temp[3] = BVar10;
    p->dest = pBVar7 + 4;
  } while( true );
}

Assistant:

static SRes Bcj2Dec_Decode(CBcj2Dec *p)
{
  if (p->range <= 5)
  {
    p->state = BCJ2_DEC_STATE_OK;
    for (; p->range != 5; p->range++)
    {
      if (p->range == 1 && p->code != 0)
        return SZ_ERROR_DATA;
      
      if (p->bufs[BCJ2_STREAM_RC] == p->lims[BCJ2_STREAM_RC])
      {
        p->state = BCJ2_STREAM_RC;
        return SZ_OK;
      }

      p->code = (p->code << 8) | *(p->bufs[BCJ2_STREAM_RC])++;
    }
    
    if (p->code == 0xFFFFFFFF)
      return SZ_ERROR_DATA;
    
    p->range = 0xFFFFFFFF;
  }
  else if (p->state >= BCJ2_DEC_STATE_ORIG_0)
  {
    while (p->state <= BCJ2_DEC_STATE_ORIG_3)
    {
      Byte *dest = p->dest;
      if (dest == p->destLim)
        return SZ_OK;
      *dest = p->temp[p->state++ - BCJ2_DEC_STATE_ORIG_0];
      p->dest = dest + 1;
    }
  }

  /*
  if (BCJ2_IS_32BIT_STREAM(p->state))
  {
    const Byte *cur = p->bufs[p->state];
    if (cur == p->lims[p->state])
      return SZ_OK;
    p->bufs[p->state] = cur + 4;
    
    {
      UInt32 val;
      Byte *dest;
      SizeT rem;
      
      p->ip += 4;
      val = GetBe32(cur) - p->ip;
      dest = p->dest;
      rem = p->destLim - dest;
      if (rem < 4)
      {
        SizeT i;
        SetUi32(p->temp, val);
        for (i = 0; i < rem; i++)
          dest[i] = p->temp[i];
        p->dest = dest + rem;
        p->state = BCJ2_DEC_STATE_ORIG_0 + (unsigned)rem;
        return SZ_OK;
      }
      SetUi32(dest, val);
      p->temp[3] = (Byte)(val >> 24);
      p->dest = dest + 4;
      p->state = BCJ2_DEC_STATE_OK;
    }
  }
  */

  for (;;)
  {
    if (BCJ2_IS_32BIT_STREAM(p->state))
      p->state = BCJ2_DEC_STATE_OK;
    else
    {
      if (p->range < kTopValue)
      {
        if (p->bufs[BCJ2_STREAM_RC] == p->lims[BCJ2_STREAM_RC])
        {
          p->state = BCJ2_STREAM_RC;
          return SZ_OK;
        }
        p->range <<= 8;
        p->code = (p->code << 8) | *(p->bufs[BCJ2_STREAM_RC])++;
      }

      {
        const Byte *src = p->bufs[BCJ2_STREAM_MAIN];
        const Byte *srcLim;
        Byte *dest;
        SizeT num = p->lims[BCJ2_STREAM_MAIN] - src;
        
        if (num == 0)
        {
          p->state = BCJ2_STREAM_MAIN;
          return SZ_OK;
        }
        
        dest = p->dest;
        if (num > (SizeT)(p->destLim - dest))
        {
          num = p->destLim - dest;
          if (num == 0)
          {
            p->state = BCJ2_DEC_STATE_ORIG;
            return SZ_OK;
          }
        }
       
        srcLim = src + num;

        if (p->temp[3] == 0x0F && (src[0] & 0xF0) == 0x80)
          *dest = src[0];
        else for (;;)
        {
          Byte b = *src;
          *dest = b;
          if (b != 0x0F)
          {
            if ((b & 0xFE) == 0xE8)
              break;
            dest++;
            if (++src != srcLim)
              continue;
            break;
          }
          dest++;
          if (++src == srcLim)
            break;
          if ((*src & 0xF0) != 0x80)
            continue;
          *dest = *src;
          break;
        }
        
        num = src - p->bufs[BCJ2_STREAM_MAIN];
        
        if (src == srcLim)
        {
          p->temp[3] = src[-1];
          p->bufs[BCJ2_STREAM_MAIN] = src;
          p->ip += (UInt32)num;
          p->dest += num;
          p->state =
            p->bufs[BCJ2_STREAM_MAIN] ==
            p->lims[BCJ2_STREAM_MAIN] ?
              (unsigned)BCJ2_STREAM_MAIN :
              (unsigned)BCJ2_DEC_STATE_ORIG;
          return SZ_OK;
        }
        
        {
          UInt32 bound, ttt;
          CProb *prob;
          Byte b = src[0];
          Byte prev = (Byte)(num == 0 ? p->temp[3] : src[-1]);
          
          p->temp[3] = b;
          p->bufs[BCJ2_STREAM_MAIN] = src + 1;
          num++;
          p->ip += (UInt32)num;
          p->dest += num;
          
          prob = p->probs + (unsigned)(b == 0xE8 ? 2 + (unsigned)prev : (b == 0xE9 ? 1 : 0));
          
          _IF_BIT_0
          {
            _UPDATE_0
            continue;
          }
          _UPDATE_1
            
        }
      }
    }

    {
      UInt32 val;
      unsigned cj = (p->temp[3] == 0xE8) ? BCJ2_STREAM_CALL : BCJ2_STREAM_JUMP;
      const Byte *cur = p->bufs[cj];
      Byte *dest;
      SizeT rem;
      
      if (cur == p->lims[cj])
      {
        p->state = cj;
        break;
      }
      
      val = GetBe32(cur);
      p->bufs[cj] = cur + 4;

      p->ip += 4;
      val -= p->ip;
      dest = p->dest;
      rem = p->destLim - dest;
      
      if (rem < 4)
      {
        SizeT i;
        SetUi32(p->temp, val);
        for (i = 0; i < rem; i++)
          dest[i] = p->temp[i];
        p->dest = dest + rem;
        p->state = BCJ2_DEC_STATE_ORIG_0 + (unsigned)rem;
        break;
      }
      
      SetUi32(dest, val);
      p->temp[3] = (Byte)(val >> 24);
      p->dest = dest + 4;
    }
  }

  if (p->range < kTopValue && p->bufs[BCJ2_STREAM_RC] != p->lims[BCJ2_STREAM_RC])
  {
    p->range <<= 8;
    p->code = (p->code << 8) | *(p->bufs[BCJ2_STREAM_RC])++;
  }

  return SZ_OK;
}